

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

bool __thiscall ON_ClippingPlaneSurface::Read(ON_ClippingPlaneSurface *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  ON__UINT32 tcode;
  int major_version;
  int minor_version;
  ON__INT64 big_value;
  uint local_34;
  int local_30 [2];
  ON__INT64 local_28;
  
  Default(this);
  local_30[0] = 0;
  local_30[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,local_30,local_30 + 1);
  if (!bVar1) {
    return false;
  }
  if (local_30[0] == 1) {
    local_34 = 0;
    local_28 = 0;
    bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk(file,&local_34,&local_28);
    if (bVar1) {
      if (local_34 == 0x40008000) {
        bVar1 = ON_PlaneSurface::Read(&this->super_ON_PlaneSurface,file);
        bVar2 = ON_BinaryArchive::EndRead3dmChunk(file);
        if (bVar2 && bVar1) {
          bVar1 = ON_ClippingPlane::Read(&this->m_clipping_plane,file);
          goto LAB_0056d705;
        }
      }
      else {
        ON_BinaryArchive::EndRead3dmChunk(file);
      }
    }
  }
  bVar1 = false;
LAB_0056d705:
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(file);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_ClippingPlaneSurface::Read( ON_BinaryArchive& file )
{
  Default();

  int major_version = 0;
  int minor_version = 0;

  bool rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;

  for(;;)
  {
    rc =  ( 1 == major_version );
    if (!rc) break;

    ON__UINT32 tcode = 0;
    ON__INT64 big_value = 0;

    rc = file.BeginRead3dmBigChunk(&tcode,&big_value)?true:false;
    if (rc)
    {
      rc = (TCODE_ANONYMOUS_CHUNK == tcode);
      if (rc)
        rc = (ON_PlaneSurface::Read(file)?true:false);
      if (!file.EndRead3dmChunk())
        rc = false;
    }
    if (!rc) break;

    rc = m_clipping_plane.Read(file);
    if (rc) break;

    break;
  }

  if (!file.EndRead3dmChunk() )
    rc = false;

  return rc;
}